

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::DivRegRegCommand::DivRegRegCommand
          (DivRegRegCommand *this,CTemp *leftOperand,CTemp *rightOperand)

{
  CTemp *rightOperand_local;
  CTemp *leftOperand_local;
  DivRegRegCommand *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239c88;
  IRT::CTemp::CTemp(&this->leftOperand,leftOperand);
  IRT::CTemp::CTemp(&this->rightOperand,rightOperand);
  return;
}

Assistant:

AssemblyCode::DivRegRegCommand::DivRegRegCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand )
        : leftOperand( leftOperand ), rightOperand( rightOperand ) { }